

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woz.cpp
# Opt level: O3

bool ReadWOZ(MemFile *file,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  uint32_t uVar2;
  char extraout_AL;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  uint8_t *puVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  exception *peVar9;
  uint uVar10;
  size_t in_RCX;
  long lVar11;
  CylHead __nbytes;
  uint32_t value_1;
  ulong uVar12;
  pointer *ppcVar13;
  ulong uVar14;
  pointer pcVar15;
  byte *pbVar16;
  pointer pcVar17;
  CylHead str;
  char *pcVar18;
  uint32_t value;
  uint uVar19;
  bool bVar20;
  vector<char,_std::allocator<char>_> meta;
  WOZ_CHUNK wc;
  uint32_t chunk_size;
  string str_meta;
  pointer local_1a0;
  pointer local_190;
  pointer local_188;
  pointer local_178;
  CylHead cylhead;
  CylHead local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  int local_138;
  WOZ_HEADER wh;
  INFO_CHUNK_conflict info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columns;
  TMAP_CHUNK tmap;
  
  MemFile::rewind(file,(FILE *)disk);
  if ((extraout_AL == '\0') ||
     (sVar5 = MemFile::read(file,(int)&wh,(void *)0xc,in_RCX), (char)sVar5 == '\0')) {
    bVar20 = false;
  }
  else {
    bVar20 = false;
    if ((wh.sig == (char  [4])0x315a4f57) && (bVar20 = false, wh.ff == 0xff)) {
      uVar19 = 0;
      bVar20 = false;
      if (wh.lfcrlf[2] == '\n' && wh.lfcrlf._0_2_ == 0xd0a) {
        puVar6 = wh.crc32;
        lVar11 = 0;
        do {
          uVar19 = uVar19 | (uint)*puVar6 << ((byte)lVar11 & 0x1f);
          lVar11 = lVar11 + 8;
          puVar6 = puVar6 + 1;
        } while (lVar11 != 0x20);
        uVar14 = 0x20;
        if (uVar19 != 0) {
          pbVar16 = (file->m_it)._M_current;
          iVar3 = MemFile::size(file);
          iVar4 = MemFile::tell(file);
          uVar14 = 0;
          if (iVar3 - iVar4 != 0) {
            lVar11 = (long)(iVar3 - iVar4);
            uVar10 = 0xffffffff;
            do {
              uVar10 = uVar10 ^ *pbVar16;
              iVar3 = 8;
              do {
                uVar10 = -(uVar10 & 1) & 0xedb88320 ^ uVar10 >> 1;
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
              pbVar16 = pbVar16 + 1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            uVar14 = (ulong)~uVar10;
          }
          if ((uint)uVar14 != uVar19) {
            Message<>(msgWarning,"file checksum is incorrect!");
          }
        }
        info.creator[0xb] = '\0';
        info.creator[0xc] = '\0';
        info.creator[0xd] = '\0';
        info.creator[0xe] = '\0';
        info.creator[0xf] = '\0';
        info.creator[0x10] = '\0';
        info.creator[0x11] = '\0';
        info.creator[0x12] = '\0';
        info.creator[0x13] = '\0';
        info.creator[0x14] = '\0';
        info.creator[0x15] = '\0';
        info.creator[0x16] = '\0';
        info.creator[0x17] = '\0';
        info.version = '\0';
        info.disk_type = '\0';
        info.write_protect = '\0';
        info.synchronised = '\0';
        info.cleaned = '\0';
        info.creator[0] = '\0';
        info.creator[1] = '\0';
        info.creator[2] = '\0';
        info.creator[3] = '\0';
        info.creator[4] = '\0';
        info.creator[5] = '\0';
        info.creator[6] = '\0';
        info.creator[7] = '\0';
        info.creator[8] = '\0';
        info.creator[9] = '\0';
        info.creator[10] = '\0';
        uVar19 = 0;
        info.creator[0x18] = '\0';
        info.creator[0x19] = '\0';
        info.creator[0x1a] = '\0';
        info.creator[0x1b] = '\0';
        info.creator[0x1c] = '\0';
        info.creator[0x1d] = '\0';
        info.creator[0x1e] = '\0';
        info.creator[0x1f] = '\0';
        memset(&tmap,0,0xa0);
        wc.type[0] = '\0';
        wc.type[1] = '\0';
        wc.type[2] = '\0';
        wc.type[3] = '\0';
        wc.size[0] = '\0';
        wc.size[1] = '\0';
        wc.size[2] = '\0';
        wc.size[3] = '\0';
        sVar5 = MemFile::read(file,(int)&wc,(void *)0x8,uVar14);
        if ((char)sVar5 != '\0') {
          lVar11 = 0;
          do {
            do {
              ppcVar13 = &meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              uVar19 = uVar19 << 8 | (uint)wc.type[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            __nbytes.cyl = 0;
            __nbytes.head = 0;
            puVar6 = wc.size;
            chunk_size = 0;
            do {
              chunk_size = chunk_size | (uint)*puVar6 << ((byte)__nbytes.cyl & 0x1f);
              __nbytes = (CylHead)((long)__nbytes + 8);
              puVar6 = puVar6 + 1;
            } while (__nbytes != (CylHead)0x20);
            local_138 = MemFile::tell(file);
            uVar2 = chunk_size;
            if ((int)uVar19 < 0x544d4150) {
              if (uVar19 == 0x494e464f) {
                sVar5 = MemFile::read(file,(int)&info,(void *)0x25,(size_t)__nbytes);
                if ((char)sVar5 == '\0') {
                  peVar9 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[24]>
                            (peVar9,(char (*) [24])"short file reading info");
                  goto LAB_001a715e;
                }
                uVar19 = (uint)info.disk_type;
                if (info.disk_type == '\x02') {
                  str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&str_meta,"3.5\"","");
                }
                else if (info.disk_type == '\x01') {
                  str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&str_meta,"5.25\"","");
                }
                else {
                  uVar10 = 3 - (info.disk_type < 100);
                  if (info.disk_type < 10) {
                    uVar10 = 1;
                  }
                  str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                  std::__cxx11::string::_M_construct((ulong)&str_meta,(char)uVar10);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (str_meta._M_dataplus._M_p,uVar10,uVar19);
                }
                peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start = (pointer)ppcVar13;
                std::__cxx11::string::_M_construct<char_const*>((string *)&meta,"disk_type","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&peVar1->metadata,(key_type *)&meta);
                std::__cxx11::string::operator=((string *)pmVar7,(string *)&str_meta);
                if ((pointer *)
                    meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != ppcVar13) {
                  operator_delete(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (ulong)(meta.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str_meta._M_dataplus._M_p != &str_meta.field_2) {
                  operator_delete(str_meta._M_dataplus._M_p,
                                  str_meta.field_2._M_allocated_capacity + 1);
                }
                pcVar18 = "yes";
                if (info.write_protect == '\0') {
                  pcVar18 = "no";
                }
                peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&str_meta,"read_only","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&peVar1->metadata,&str_meta);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str_meta._M_dataplus._M_p != &str_meta.field_2) {
                  operator_delete(str_meta._M_dataplus._M_p,
                                  str_meta.field_2._M_allocated_capacity + 1);
                }
                pcVar18 = "yes";
                if (info.synchronised == '\0') {
                  pcVar18 = "no";
                }
                peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&str_meta,"synchronised","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&peVar1->metadata,&str_meta);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str_meta._M_dataplus._M_p != &str_meta.field_2) {
                  operator_delete(str_meta._M_dataplus._M_p,
                                  str_meta.field_2._M_allocated_capacity + 1);
                }
                pcVar18 = "yes";
                if (info.cleaned == '\0') {
                  pcVar18 = "no";
                }
                peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&str_meta,"cleaned","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&peVar1->metadata,&str_meta);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str_meta._M_dataplus._M_p != &str_meta.field_2) {
                  operator_delete(str_meta._M_dataplus._M_p,
                                  str_meta.field_2._M_allocated_capacity + 1);
                }
                ppcVar13 = &meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                cylhead.cyl = 0x20;
                cylhead.head = 0;
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start = (pointer)ppcVar13;
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start = (pointer)std::__cxx11::string::_M_create((ulong *)&meta,(ulong)&cylhead)
                ;
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage = (pointer)cylhead;
                *(ulong *)(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x10) =
                     CONCAT53(info.creator._19_5_,info.creator._16_3_);
                *(ulong *)(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x18) =
                     CONCAT53(info.creator._27_5_,info.creator._24_3_);
                *(ulong *)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start =
                     CONCAT53(info.creator._3_5_,info.creator._0_3_);
                *(ulong *)(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + 8) =
                     CONCAT53(info.creator._11_5_,info.creator._8_3_);
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_finish = (pointer)cylhead;
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start[(long)cylhead] = '\0';
                util::trim(&str_meta,(string *)&meta);
                peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                __nbytes = cylhead;
                cylhead = (CylHead)&local_148;
                std::__cxx11::string::_M_construct<char_const*>((string *)&cylhead,"creator","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&peVar1->metadata,(key_type *)&cylhead);
                std::__cxx11::string::operator=((string *)pmVar7,(string *)&str_meta);
                if (cylhead != (CylHead)&local_148) {
                  operator_delete((void *)cylhead,local_148._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str_meta._M_dataplus._M_p != &str_meta.field_2) {
                  operator_delete(str_meta._M_dataplus._M_p,
                                  str_meta.field_2._M_allocated_capacity + 1);
                }
                if ((pointer *)
                    meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != ppcVar13) {
                  pcVar15 = meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1;
                  goto LAB_001a6ffd;
                }
              }
              else if (uVar19 == 0x4d455441) {
                std::vector<char,_std::allocator<char>_>::vector
                          (&meta,(ulong)chunk_size,(allocator_type *)&str_meta);
                iVar4 = (int)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                        (int)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                iVar3 = MemFile::remaining(file);
                if (iVar3 < iVar4) {
                  peVar9 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[30]>
                            (peVar9,(char (*) [30])"short file reading meta chunk");
                  __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
                }
                memcpy(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(file->m_it)._M_current,(long)iVar4);
                (file->m_it)._M_current = (file->m_it)._M_current + iVar4;
                str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&str_meta,
                           meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                __nbytes.cyl = 0;
                __nbytes.head = 0;
                util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cylhead,&str_meta,'\n',false);
                for (str = cylhead; str != local_150; str = (CylHead)((long)str + 0x20)) {
                  __nbytes.cyl = 0;
                  __nbytes.head = 0;
                  util::split(&columns,(string *)str,'\t',false);
                  if ((long)columns.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)columns.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
                    pmVar7 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[](&((disk->
                                            super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                                           _M_ptr)->metadata,
                                          columns.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                    std::__cxx11::string::_M_assign((string *)pmVar7);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&columns);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&cylhead);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str_meta._M_dataplus._M_p != &str_meta.field_2) {
                  operator_delete(str_meta._M_dataplus._M_p,
                                  str_meta.field_2._M_allocated_capacity + 1);
                }
                if (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  pcVar15 = meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage +
                            -(long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start;
LAB_001a6ffd:
                  operator_delete(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,(ulong)pcVar15);
                }
              }
              else {
LAB_001a6b3f:
                str_meta._M_dataplus._M_p = (pointer)0x4;
                meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start = (pointer)&wc;
                __nbytes = (CylHead)&meta;
                Message<unsigned_long,char_const*,unsigned_char&,unsigned_char&,unsigned_char&,unsigned_char&,unsigned_int&>
                          (msgWarning,"unknown WOZ chunk: %.*s [%02X %02X %02X %02X] with size %u",
                           (unsigned_long *)&str_meta,(char **)&meta,
                           (uchar *)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_start,wc.type + 1,wc.type + 2,
                           wc.type + 3,&chunk_size);
                iVar3 = MemFile::tell(file);
                MemFile::seek(file,iVar3 + chunk_size);
              }
            }
            else if (uVar19 == 0x544d4150) {
              sVar5 = MemFile::read(file,(int)&tmap,(void *)0xa0,(size_t)__nbytes);
              if ((char)sVar5 == '\0') {
                peVar9 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<char_const(&)[29]>
                          (peVar9,(char (*) [29])"short file reading track map");
LAB_001a715e:
                __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
            }
            else {
              if (uVar19 != 0x54524b53) goto LAB_001a6b3f;
              if (0x9d89d < (chunk_size * -0x3b13b13b >> 9 | chunk_size * 0x62800000)) {
                peVar9 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<char_const(&)[31]>
                          (peVar9,(char (*) [31])"TRKS chunk size is mis-aligned");
                goto LAB_001a715e;
              }
              uVar19 = chunk_size / 0x1a00;
              std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::vector
                        ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)&meta,
                         (size_type)(ulong)uVar19,(allocator_type *)&str_meta);
              str_meta._M_dataplus._M_p = (pointer)0x0;
              if (0x19ff < uVar2) {
                lVar11 = 0;
                pcVar17 = (pointer)0x1;
                do {
                  sVar5 = MemFile::read(file,(int)meta.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                             (int)lVar11,(void *)0x1a00,(size_t)__nbytes);
                  if ((char)sVar5 == '\0') {
                    peVar9 = (exception *)__cxa_allocate_exception(0x10);
                    util::exception::exception<char_const(&)[30]>
                              (peVar9,(char (*) [30])"short file reading track data");
LAB_001a70be:
                    __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error
                               );
                  }
                  if (*(ushort *)
                       (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11 + 0x19f8) + 7 >> 3 !=
                      (uint)*(ushort *)
                             (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar11 + 0x19f6)) {
                    peVar9 = (exception *)__cxa_allocate_exception(0x10);
                    util::exception::exception<char_const(&)[39],unsigned_long&>
                              (peVar9,(char (*) [39])"bit/byte counts inconsistent on track ",
                               (unsigned_long *)&str_meta);
                    goto LAB_001a70be;
                  }
                  util::bit_reverse((uint8_t *)
                                    (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar11),
                                    (uint)*(ushort *)
                                           (meta.super__Vector_base<char,_std::allocator<char>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                           lVar11 + 0x19f6));
                  str_meta._M_dataplus._M_p = pcVar17;
                  lVar11 = lVar11 + 0x1a00;
                  bVar20 = pcVar17 < (pointer)(ulong)uVar19;
                  pcVar17 = pcVar17 + 1;
                } while (bVar20);
              }
              bVar20 = info.disk_type == '\x01';
              uVar14 = 0;
              do {
                uVar8 = (ulong)tmap.map._M_elems[uVar14];
                uVar12 = ((long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start >> 9) * 0x4ec4ec4ec4ec4ec5;
                __nbytes = (CylHead)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                if (uVar8 <= uVar12 && uVar12 - uVar8 != 0) {
                  puVar6 = (uint8_t *)
                           (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 * 0x1a00);
                  BitBuffer::BitBuffer
                            ((BitBuffer *)&str_meta,_250K,puVar6,
                             (uint)*(ushort *)
                                    (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar8 * 0x1a00 + 0x19f8));
                  uVar19 = (uint)*(ushort *)(puVar6 + 0x19fa);
                  if (uVar19 != 0xffff) {
                    BitBuffer::splicepos((BitBuffer *)&str_meta,uVar19);
                  }
                  __nbytes = (CylHead)(((long)meta.super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)meta.super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start >> 9) *
                                      0x4ec4ec4ec4ec4ec5);
                  CylHead::CylHead(&cylhead,(uint)tmap.map._M_elems[uVar14],
                                   (int)((uVar14 >> bVar20 * '\x02') / (ulong)__nbytes));
                  Disk::write((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                              (int)&cylhead,(BitBuffer *)&str_meta,(size_t)__nbytes);
                  if (local_188 != (pointer)0x0) {
                    operator_delete(local_188,(long)local_178 - (long)local_188);
                  }
                  if (local_1a0 != (pointer)0x0) {
                    operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
                  }
                  if (str_meta._M_string_length != 0) {
                    operator_delete((void *)str_meta._M_string_length,
                                    str_meta.field_2._8_8_ - str_meta._M_string_length);
                  }
                }
                uVar14 = uVar14 + (ulong)bVar20 * 3 + 1;
              } while (uVar14 < 0xa0);
              if (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
            }
            MemFile::seek(file,uVar2 + local_138);
            sVar5 = MemFile::read(file,(int)&wc,(void *)0x8,(size_t)__nbytes);
            uVar19 = 0;
            lVar11 = 0;
          } while ((char)sVar5 != '\0');
        }
        peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::_M_replace
                  ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0d51);
        bVar20 = true;
      }
    }
  }
  return bVar20;
}

Assistant:

bool ReadWOZ(MemFile& file, std::shared_ptr<Disk>& disk)
{
    WOZ_HEADER wh;
    if (!file.rewind() || !file.read(&wh, sizeof(wh)) || memcmp(&wh.sig, WOZ_SIGNATURE, sizeof(wh.sig)))
        return false;
    else if (wh.ff != 0xff || memcmp(&wh.lfcrlf, "\n\r\n", 3))
        return false;

    auto crc = util::le_value(wh.crc32);
    if (crc && crc32(file.ptr<uint8_t>(), file.size() - file.tell()) != crc)
        Message(msgWarning, "file checksum is incorrect!");

    INFO_CHUNK info{};
    TMAP_CHUNK tmap{};
    WOZ_CHUNK wc{};

    while (file.read(&wc, sizeof(wc)))
    {
        auto chunk_id = util::be_value(wc.type);    // big-endian for text
        auto chunk_size = util::le_value(wc.size);
        auto next_pos = file.tell() + chunk_size;

        switch (chunk_id)
        {
        case id_value("INFO"):
        {
            if (!file.read(&info, sizeof(info)))
                throw util::exception("short file reading info");

            disk->metadata["disk_type"] = (info.disk_type == 1) ? "5.25\"" :
                (info.disk_type == 2) ? "3.5\"" : std::to_string(info.disk_type);
            disk->metadata["read_only"] = info.write_protect ? "yes" : "no";
            disk->metadata["synchronised"] = info.synchronised ? "yes" : "no";
            disk->metadata["cleaned"] = info.cleaned ? "yes" : "no";
            disk->metadata["creator"] =
                util::trim(std::string(info.creator, sizeof(info.creator)));
            break;
        }

        case id_value("TMAP"):
            if (!file.read(&tmap, sizeof(tmap)))
                throw util::exception("short file reading track map");
            break;

        case id_value("TRKS"):
        {
            if (chunk_size % sizeof(TRKS_CHUNK))
                throw util::exception("TRKS chunk size is mis-aligned");

            auto tracks = chunk_size / sizeof(TRKS_CHUNK);
            std::vector<TRKS_CHUNK> trks(tracks);

            for (size_t i = 0; i < tracks; ++i)
            {
                if (!file.read(&trks[i], sizeof(trks[i])))
                    throw util::exception("short file reading track data");
                else if (util::le_value(trks[i].used_bytes) !=
                    (util::le_value(trks[i].used_bits) + 7) / 8)
                    throw util::exception("bit/byte counts inconsistent on track ", i);

                util::bit_reverse(trks[i].data, util::le_value(trks[i].used_bytes));
            }

            int cyl_step = (info.disk_type == 1) ? 4 : 1;
            for (size_t i = 0; i < tmap.map.size(); i += cyl_step)
            {
                if (tmap.map[i] < trks.size())
                {
                    auto& trk = trks[tmap.map[i]];
                    BitBuffer bitbuf(DataRate::_250K, trk.data, util::le_value(trk.used_bits));

                    auto splicepos = util::le_value(trk.splice_pos);
                    if (splicepos != 0xffff)
                        bitbuf.splicepos(splicepos);

                    auto cylhead = CylHead(tmap.map[i], static_cast<int>((i / cyl_step) / trks.size()));
                    disk->write(cylhead, std::move(bitbuf));
                }
            }
            break;
        }

        case id_value("META"):
        {
            std::vector<char> meta(chunk_size);
            if (!file.read(meta))
                throw util::exception("short file reading meta chunk");

            auto str_meta = std::string(meta.data(), meta.size());
            for (auto& row : util::split(str_meta, '\n'))
            {
                auto columns = util::split(row, '\t');
                if (columns.size() == 2)
                    disk->metadata[columns[0]] = columns[1];
            }
            break;
        }

        default:
            Message(msgWarning, "unknown WOZ chunk: %.*s [%02X %02X %02X %02X] with size %u",
                sizeof(wc.type), reinterpret_cast<const char*>(wc.type),
                wc.type[0], wc.type[1], wc.type[2], wc.type[3], chunk_size);

            file.seek(file.tell() + chunk_size);
            break;
        }

        file.seek(next_pos);
    }

    disk->strType = "WOZ";
    return true;
}